

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCloneWildcardNsConstraints
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaWildcardPtr dest,xmlSchemaWildcardPtr source)

{
  _xmlSchemaWildcardNs *p_Var1;
  xmlSchemaWildcardNsPtr pxVar2;
  xmlSchemaWildcardNsPtr pxVar3;
  int iVar4;
  xmlSchemaWildcardNsPtr pxVar5;
  
  iVar4 = -1;
  if (dest != (xmlSchemaWildcardPtr)0x0 && source != (xmlSchemaWildcardPtr)0x0) {
    dest->any = source->any;
    pxVar3 = source->nsSet;
    if (pxVar3 != (xmlSchemaWildcardNsPtr)0x0) {
      pxVar5 = (xmlSchemaWildcardNsPtr)0x0;
      do {
        pxVar2 = xmlSchemaNewWildcardNsConstraint(ctxt);
        if (pxVar2 == (xmlSchemaWildcardNsPtr)0x0) {
          return -1;
        }
        pxVar2->value = pxVar3->value;
        if (pxVar5 == (xmlSchemaWildcardNsPtr)0x0) {
          pxVar5 = (xmlSchemaWildcardNsPtr)&dest->nsSet;
        }
        pxVar5->next = pxVar2;
        pxVar3 = pxVar3->next;
        pxVar5 = pxVar2;
      } while (pxVar3 != (_xmlSchemaWildcardNs *)0x0);
    }
    pxVar3 = dest->negNsSet;
    while (pxVar3 != (xmlSchemaWildcardNsPtr)0x0) {
      p_Var1 = pxVar3->next;
      (*xmlFree)(pxVar3);
      pxVar3 = p_Var1;
    }
    if (source->negNsSet == (xmlSchemaWildcardNsPtr)0x0) {
      dest->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
    }
    else {
      pxVar3 = xmlSchemaNewWildcardNsConstraint(ctxt);
      dest->negNsSet = pxVar3;
      if (pxVar3 == (xmlSchemaWildcardNsPtr)0x0) {
        return -1;
      }
      pxVar3->value = source->negNsSet->value;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
xmlSchemaCloneWildcardNsConstraints(xmlSchemaParserCtxtPtr ctxt,
				    xmlSchemaWildcardPtr dest,
				    xmlSchemaWildcardPtr source)
{
    xmlSchemaWildcardNsPtr cur, tmp, last;

    if ((source == NULL) || (dest == NULL))
	return(-1);
    dest->any = source->any;
    cur = source->nsSet;
    last = NULL;
    while (cur != NULL) {
	tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (tmp == NULL)
	    return(-1);
	tmp->value = cur->value;
	if (last == NULL)
	    dest->nsSet = tmp;
	else
	    last->next = tmp;
	last = tmp;
	cur = cur->next;
    }
    if (dest->negNsSet != NULL)
	xmlSchemaFreeWildcardNsSet(dest->negNsSet);
    if (source->negNsSet != NULL) {
	dest->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (dest->negNsSet == NULL)
	    return(-1);
	dest->negNsSet->value = source->negNsSet->value;
    } else
	dest->negNsSet = NULL;
    return(0);
}